

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O0

int i2d_PKCS8_PRIV_KEY_INFO_fp(FILE *fp,PKCS8_PRIV_KEY_INFO *p8inf)

{
  BIO *bp;
  int ret;
  BIO *bio;
  PKCS8_PRIV_KEY_INFO *obj_local;
  FILE *fp_local;
  
  bp = BIO_new_fp(fp,0);
  if (bp == (BIO *)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    fp_local._4_4_ = i2d_PKCS8_PRIV_KEY_INFO_bio(bp,p8inf);
    BIO_free(bp);
  }
  return fp_local._4_4_;
}

Assistant:

int i2d_PKCS8PrivateKeyInfo_fp(FILE *fp, EVP_PKEY *key) {
  PKCS8_PRIV_KEY_INFO *p8inf;
  int ret;
  p8inf = EVP_PKEY2PKCS8(key);
  if (!p8inf) {
    return 0;
  }
  ret = i2d_PKCS8_PRIV_KEY_INFO_fp(fp, p8inf);
  PKCS8_PRIV_KEY_INFO_free(p8inf);
  return ret;
}